

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timestamp_comparison.cpp
# Opt level: O2

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::TimeStampComparison::Apply
          (TimeStampComparison *this,LogicalOperator *op,
          vector<std::reference_wrapper<duckdb::Expression>,_true> *bindings,bool *changes_made,
          bool is_root)

{
  ClientContext *context;
  _Head_base<0UL,_duckdb::BoundConjunctionExpression_*,_false> _Var1;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var2;
  __uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_> _Var3;
  undefined8 uVar4;
  bool bVar5;
  date_t dVar6;
  reference pvVar7;
  type pEVar8;
  timestamp_t value;
  pointer pEVar9;
  pointer pBVar10;
  bool is_constant;
  ExpressionType local_181;
  _Head_base<0UL,_duckdb::BoundConjunctionExpression_*,_false> local_180;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_178;
  __uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_> local_170;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> local_168;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_160;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_158;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_150;
  _Head_base<0UL,_duckdb::BoundConstantExpression_*,_false> local_148;
  _Head_base<0UL,_duckdb::BoundConstantExpression_*,_false> local_140;
  date_t date_t_result;
  Value result;
  LogicalType local_f0;
  Value original_val_plus_on_date_ts;
  Value result_as_val;
  Value original_val_ts;
  
  pvVar7 = vector<std::reference_wrapper<duckdb::Expression>,_true>::get<true>
                     ((vector<std::reference_wrapper<duckdb::Expression>,_true> *)changes_made,3);
  (*(pvVar7->_M_data->super_BaseExpression)._vptr_BaseExpression[0x11])(&local_170);
  pvVar7 = vector<std::reference_wrapper<duckdb::Expression>,_true>::get<true>
                     ((vector<std::reference_wrapper<duckdb::Expression>,_true> *)changes_made,2);
  (*(pvVar7->_M_data->super_BaseExpression)._vptr_BaseExpression[0x11])(&local_178);
  is_constant = true;
  pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)&local_170);
  ExpressionIsConstant(pEVar8,&is_constant);
  if (is_constant == false) {
    pvVar7 = vector<std::reference_wrapper<duckdb::Expression>,_true>::get<true>
                       ((vector<std::reference_wrapper<duckdb::Expression>,_true> *)changes_made,4);
    (*(pvVar7->_M_data->super_BaseExpression)._vptr_BaseExpression[0x11])(&result);
    uVar4 = result.type_._0_8_;
    _Var3._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
         local_170._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    result.type_.id_ = INVALID;
    result.type_.physical_type_ = ~INVALID;
    result.type_._2_6_ = 0;
    local_170._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
         (tuple<duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
         (tuple<duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)uVar4;
    if ((_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
        _Var3._M_t.
        super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl != (Expression *)0x0) {
      (**(code **)(*(long *)_Var3._M_t.
                            super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                            .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl + 8))()
      ;
      if (result.type_._0_8_ != 0) {
        (**(code **)(*(long *)result.type_._0_8_ + 8))();
      }
    }
    pvVar7 = vector<std::reference_wrapper<duckdb::Expression>,_true>::get<true>
                       ((vector<std::reference_wrapper<duckdb::Expression>,_true> *)changes_made,3);
    (*(pvVar7->_M_data->super_BaseExpression)._vptr_BaseExpression[0x11])(&result);
    uVar4 = result.type_._0_8_;
    _Var2._M_head_impl = local_178._M_head_impl;
    result.type_.id_ = INVALID;
    result.type_.physical_type_ = ~INVALID;
    result.type_._2_6_ = 0;
    local_178._M_head_impl = (Expression *)uVar4;
    if (_Var2._M_head_impl != (Expression *)0x0) {
      (*((_Var2._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
      if (result.type_._0_8_ != 0) {
        (**(code **)(*(long *)result.type_._0_8_ + 8))();
      }
    }
  }
  result.type_.id_ = HUGEINT;
  make_uniq<duckdb::BoundConjunctionExpression,duckdb::ExpressionType>
            ((duckdb *)&local_180,(ExpressionType *)&result);
  LogicalType::LogicalType(&local_f0,SQLNULL);
  Value::Value(&result,&local_f0);
  LogicalType::~LogicalType(&local_f0);
  context = (ClientContext *)
            (op->children).
            super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)&local_170);
  bVar5 = ExpressionExecutor::TryEvaluateScalar(context,pEVar8,&result);
  if (bVar5) {
    dVar6 = Value::GetValue<duckdb::date_t>(&result);
    Value::TIMESTAMP(&original_val_ts,dVar6,(dtime_t)0x0);
    make_uniq<duckdb::BoundConstantExpression,duckdb::Value&>((duckdb *)&local_140,&original_val_ts)
    ;
    dVar6 = Value::GetValue<duckdb::date_t>(&result);
    bVar5 = TryAddOperator::Operation<duckdb::date_t,int,duckdb::date_t>(dVar6,1,&date_t_result);
    if (bVar5) {
      Value::DATE(&result_as_val,date_t_result);
      value = Value::GetValue<duckdb::timestamp_t>(&result_as_val);
      Value::TIMESTAMP(&original_val_plus_on_date_ts,value);
      make_uniq<duckdb::BoundConstantExpression,duckdb::Value&>
                ((duckdb *)&local_148,&original_val_plus_on_date_ts);
      pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                           *)&local_178);
      (*(pEVar9->super_BaseExpression)._vptr_BaseExpression[0x11])(&local_150,pEVar9);
      pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                           *)&local_178);
      (*(pEVar9->super_BaseExpression)._vptr_BaseExpression[0x11])(&local_158,pEVar9);
      local_168.super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl._0_1_ = (duckdb)0x1b;
      make_uniq_base<duckdb::Expression,duckdb::BoundComparisonExpression,duckdb::ExpressionType,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,duckdb::unique_ptr<duckdb::BoundConstantExpression,std::default_delete<duckdb::BoundConstantExpression>,true>>
                ((duckdb *)&local_160,(ExpressionType *)&local_168,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &local_158,
                 (unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>
                  *)&local_148);
      local_181 = COMPARE_GREATERTHANOREQUALTO;
      make_uniq_base<duckdb::Expression,duckdb::BoundComparisonExpression,duckdb::ExpressionType,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,duckdb::unique_ptr<duckdb::BoundConstantExpression,std::default_delete<duckdb::BoundConstantExpression>,true>>
                ((duckdb *)&local_168,&local_181,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &local_150,
                 (unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>
                  *)&local_140);
      pBVar10 = unique_ptr<duckdb::BoundConjunctionExpression,_std::default_delete<duckdb::BoundConjunctionExpression>,_true>
                ::operator->((unique_ptr<duckdb::BoundConjunctionExpression,_std::default_delete<duckdb::BoundConjunctionExpression>,_true>
                              *)&local_180);
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)&pBVar10->children,&local_168);
      pBVar10 = unique_ptr<duckdb::BoundConjunctionExpression,_std::default_delete<duckdb::BoundConjunctionExpression>,_true>
                ::operator->((unique_ptr<duckdb::BoundConjunctionExpression,_std::default_delete<duckdb::BoundConjunctionExpression>,_true>
                              *)&local_180);
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)&pBVar10->children,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &local_160);
      _Var1._M_head_impl = local_180._M_head_impl;
      local_180._M_head_impl = (BoundConjunctionExpression *)0x0;
      (this->super_Rule)._vptr_Rule = (_func_int **)_Var1._M_head_impl;
      if ((long *)CONCAT71(local_168.
                           super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                           ._M_t.
                           super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                           .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl._1_7_,
                           local_168.
                           super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                           ._M_t.
                           super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                           .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl._0_1_)
          != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(local_168.
                                       super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                                       ._M_t.
                                       super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                                       .super__Head_base<0UL,_duckdb::Expression_*,_false>.
                                       _M_head_impl._1_7_,
                                       local_168.
                                       super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                                       ._M_t.
                                       super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                                       .super__Head_base<0UL,_duckdb::Expression_*,_false>.
                                       _M_head_impl._0_1_) + 8))();
      }
      if (local_160._M_head_impl != (Expression *)0x0) {
        (*((local_160._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
      if (local_158._M_head_impl != (Expression *)0x0) {
        (*((local_158._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
      if (local_150._M_head_impl != (Expression *)0x0) {
        (*((local_150._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
      if (local_148._M_head_impl != (BoundConstantExpression *)0x0) {
        (*((local_148._M_head_impl)->super_Expression).super_BaseExpression._vptr_BaseExpression[1])
                  ();
      }
      Value::~Value(&original_val_plus_on_date_ts);
      Value::~Value(&result_as_val);
    }
    else {
      (this->super_Rule)._vptr_Rule = (_func_int **)0x0;
    }
    if (local_140._M_head_impl != (BoundConstantExpression *)0x0) {
      (*((local_140._M_head_impl)->super_Expression).super_BaseExpression._vptr_BaseExpression[1])()
      ;
    }
    Value::~Value(&original_val_ts);
  }
  else {
    (this->super_Rule)._vptr_Rule = (_func_int **)0x0;
  }
  Value::~Value(&result);
  if (local_180._M_head_impl != (BoundConjunctionExpression *)0x0) {
    (*((local_180._M_head_impl)->super_Expression).super_BaseExpression._vptr_BaseExpression[1])();
  }
  if (local_178._M_head_impl != (Expression *)0x0) {
    (*((local_178._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  if (local_170._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl !=
      (_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)0x0) {
    (**(code **)(*(long *)local_170._M_t.
                          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                          .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl + 8))();
  }
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> TimeStampComparison::Apply(LogicalOperator &op, vector<reference<Expression>> &bindings,
                                                  bool &changes_made, bool is_root) {
	auto cast_constant = bindings[3].get().Copy();
	auto cast_columnref = bindings[2].get().Copy();
	auto is_constant = true;
	ExpressionIsConstant(*cast_constant, is_constant);
	if (!is_constant) {
		// means the matchers are flipped, so we need to flip our bindings
		// for some reason an extra binding is added in this case.
		cast_constant = bindings[4].get().Copy();
		cast_columnref = bindings[3].get().Copy();
	}
	auto new_expr = make_uniq<BoundConjunctionExpression>(ExpressionType::CONJUNCTION_AND);

	Value result;
	if (ExpressionExecutor::TryEvaluateScalar(context, *cast_constant, result)) {
		D_ASSERT(result.type() == LogicalType::DATE);
		auto original_val = result.GetValue<duckdb::date_t>();
		auto no_seconds = dtime_t(0);

		// original date as timestamp with no seconds
		auto original_val_ts = Value::TIMESTAMP(original_val, no_seconds);
		auto original_val_for_comparison = make_uniq<BoundConstantExpression>(original_val_ts);

		// add one day and validate the new date
		// code is inspired by AddOperator::Operation(date_t left, int32_t right). The function wasn't used directly
		// since it throws errors that I cannot catch here.

		auto date_t_copy = result.GetValue<duckdb::date_t>();
		date_t date_t_result;
		// attempt to add 1 day
		if (!TryAddOperator::Operation<date_t, int32_t, date_t>(date_t_copy, 1, date_t_result)) {
			// don't rewrite the expression and let the expression executor handle the invalid date
			return nullptr;
		}

		auto result_as_val = Value::DATE(date_t_result);
		auto original_val_plus_on_date_ts = Value::TIMESTAMP(result_as_val.GetValue<timestamp_t>());

		auto val_for_comparison = make_uniq<BoundConstantExpression>(original_val_plus_on_date_ts);

		auto left_copy = cast_columnref->Copy();
		auto right_copy = cast_columnref->Copy();
		auto lt_eq_expr = make_uniq_base<Expression, BoundComparisonExpression>(
		    ExpressionType::COMPARE_LESSTHAN, std::move(right_copy), std::move(val_for_comparison));
		auto gt_eq_expr = make_uniq_base<Expression, BoundComparisonExpression>(
		    ExpressionType::COMPARE_GREATERTHANOREQUALTO, std::move(left_copy), std::move(original_val_for_comparison));
		new_expr->children.push_back(std::move(gt_eq_expr));
		new_expr->children.push_back(std::move(lt_eq_expr));
		return std::move(new_expr);
	}
	return nullptr;
}